

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

AV1_COMP * av1_get_parallel_frame_enc_data(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  AV1_COMP_DATA *data;
  int i;
  int cpi_idx;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 1;
  do {
    if (*(int *)(in_RDI + 0x29) <= local_18) {
LAB_0021de54:
      if (*(long *)(in_RDI[0x2c] + 0x3c068) != 0) {
        **(int **)(in_RDI[0x2c] + 0x3c068) = **(int **)(in_RDI[0x2c] + 0x3c068) + -1;
        *(undefined8 *)(in_RDI[0x2c] + 0x3c068) = 0;
      }
      in_RDI[0x2c] = in_RDI[local_14];
      in_RDI[local_14] = *in_RDI;
      *in_RDI = in_RDI[0x2c];
      puVar1 = in_RDI + (long)(local_14 + -1) * 9 + 4;
      if ((ulong)in_RSI[1] < (ulong)puVar1[2]) {
        aom_internal_error((aom_internal_error_info *)(in_RDI + 0x18ec),AOM_CODEC_ERROR,
                           "first_cpi_data->cx_data buffer full");
      }
      *(undefined4 *)(in_RSI + 3) = *(undefined4 *)(puVar1 + 3);
      in_RSI[4] = puVar1[4];
      in_RSI[5] = puVar1[5];
      memcpy((void *)*in_RSI,(void *)*puVar1,puVar1[2]);
      in_RSI[2] = puVar1[2];
      if (*(int *)(in_RDI[0x2c] + 0x3c160) != 0) {
        *(undefined4 *)(in_RSI + 8) = 1;
      }
      return (AV1_COMP *)in_RDI[0x2c];
    }
    if (*(char *)(in_RDI[0x2c] + 0x712c0) == *(char *)(in_RDI[local_18] + 0x712c0)) {
      local_14 = local_18;
      goto LAB_0021de54;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

AV1_COMP *av1_get_parallel_frame_enc_data(AV1_PRIMARY *const ppi,
                                          AV1_COMP_DATA *const first_cpi_data) {
  int cpi_idx = 0;

  // Loop over parallel_cpi to find the cpi that processed the current
  // gf_frame_index ahead of time.
  for (int i = 1; i < ppi->num_fp_contexts; i++) {
    if (ppi->cpi->gf_frame_index == ppi->parallel_cpi[i]->gf_frame_index) {
      cpi_idx = i;
      break;
    }
  }

  assert(cpi_idx > 0);
  assert(!ppi->parallel_cpi[cpi_idx]->common.show_existing_frame);

  // Release the previously-used frame-buffer.
  if (ppi->cpi->common.cur_frame != NULL) {
    --ppi->cpi->common.cur_frame->ref_count;
    ppi->cpi->common.cur_frame = NULL;
  }

  // Swap the appropriate parallel_cpi with the parallel_cpi[0].
  ppi->cpi = ppi->parallel_cpi[cpi_idx];
  ppi->parallel_cpi[cpi_idx] = ppi->parallel_cpi[0];
  ppi->parallel_cpi[0] = ppi->cpi;

  // Copy appropriate parallel_frames_data to local data.
  {
    AV1_COMP_DATA *data = &ppi->parallel_frames_data[cpi_idx - 1];
    assert(data->frame_size > 0);
    if (data->frame_size > first_cpi_data->cx_data_sz) {
      aom_internal_error(&ppi->error, AOM_CODEC_ERROR,
                         "first_cpi_data->cx_data buffer full");
    }

    first_cpi_data->lib_flags = data->lib_flags;
    first_cpi_data->ts_frame_start = data->ts_frame_start;
    first_cpi_data->ts_frame_end = data->ts_frame_end;
    memcpy(first_cpi_data->cx_data, data->cx_data, data->frame_size);
    first_cpi_data->frame_size = data->frame_size;
    if (ppi->cpi->common.show_frame) {
      first_cpi_data->pop_lookahead = 1;
    }
  }

  return ppi->cpi;
}